

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

value_type_conflict7 * __thiscall nonstd::optional_lite::optional<int>::value(optional<int> *this)

{
  if (this->has_value_ != false) {
    return (value_type_conflict7 *)&this->contained;
  }
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x584,
                "const value_type &nonstd::optional_lite::optional<int>::value() const [T = int]");
}

Assistant:

optional_constexpr14 value_type const & value() const optional_ref_qual
    {
#if optional_CONFIG_NO_EXCEPTIONS
        assert( has_value() );
#else
        if ( ! has_value() )
        {
            throw bad_optional_access();
        }
#endif
        return contained.value();
    }